

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cpp
# Opt level: O0

void __thiscall ary::CameraModel::CameraModel(CameraModel *this,string *calibration)

{
  byte bVar1;
  undefined8 *puVar2;
  runtime_error *this_00;
  Matx<float,_3,_3> local_19c;
  FileNode local_178 [24];
  FileNode local_160 [24];
  undefined1 local_148 [8];
  Mat td;
  Mat ti;
  FileStorage local_58 [8];
  FileStorage fs;
  string *calibration_local;
  CameraModel *this_local;
  
  this->_vptr_CameraModel = (_func_int **)&PTR__CameraModel_00181660;
  cv::Matx<float,_3,_3>::Matx(&this->intrinsics);
  cv::Mat::Mat(&this->distortion);
  cv::FileStorage::FileStorage(local_58);
  std::__cxx11::string::string((string *)(ti.step.buf + 1));
  bVar1 = cv::FileStorage::open((string *)local_58,(int)calibration,(string *)0x0);
  std::__cxx11::string::~string((string *)(ti.step.buf + 1));
  if (((bVar1 ^ 0xff) & 1) == 0) {
    cv::Mat::Mat((Mat *)(td.step.buf + 1));
    cv::Mat::Mat((Mat *)local_148);
    cv::FileStorage::operator[]((char *)local_160);
    cv::operator>>(local_160,(Mat *)(td.step.buf + 1));
    cv::FileStorage::operator[]((char *)local_178);
    cv::operator>>(local_178,(Mat *)local_148);
    cv::Mat::operator_cast_to_Matx(&local_19c,(Mat *)(td.step.buf + 1));
    (this->intrinsics).val[8] = local_19c.val[8];
    *(undefined8 *)((this->intrinsics).val + 4) = local_19c.val._16_8_;
    *(undefined8 *)((this->intrinsics).val + 6) = local_19c.val._24_8_;
    *(undefined8 *)(this->intrinsics).val = local_19c.val._0_8_;
    *(undefined8 *)((this->intrinsics).val + 2) = local_19c.val._8_8_;
    cv::Mat::operator=(&this->distortion,(Mat *)local_148);
    cv::Mat::~Mat((Mat *)local_148);
    cv::Mat::~Mat((Mat *)(td.step.buf + 1));
    cv::FileStorage::~FileStorage(local_58);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  this_00 = (runtime_error *)operator_new(0x10);
  std::runtime_error::runtime_error(this_00,"Calibration file does not extist");
  *puVar2 = this_00;
  __cxa_throw(puVar2,&std::runtime_error*::typeinfo,0);
}

Assistant:

CameraModel::CameraModel(const string& calibration) {

    FileStorage fs;

    if (!fs.open(calibration, FileStorage::READ))
        throw new runtime_error("Calibration file does not extist");

    Mat ti, td;

    fs["intrinsics"] >> ti;
    fs["distortion"] >> td;

    intrinsics = ti;
    distortion = td;
}